

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

uint decode_pred_count(uint fullsz,int pattern,int esz)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  bVar2 = (byte)esz & 0x1f;
  uVar3 = fullsz >> bVar2;
  uVar4 = uVar3;
  switch(pattern) {
  case 0:
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar4 = (uint)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
    if (fullsz >> bVar2 == 0) {
      uVar4 = uVar3;
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    pattern = 0x10 << ((char)pattern - 9U & 0x1f);
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar4 = 0;
    if ((uint)pattern <= uVar3) {
      uVar4 = pattern;
    }
    break;
  default:
    uVar4 = 0 >> bVar2;
    break;
  case 0x1d:
    uVar4 = uVar3 & 0xfffffffc;
    break;
  case 0x1e:
    uVar4 = uVar3 - uVar3 % 3;
    break;
  case 0x1f:
    break;
  }
  return uVar4;
}

Assistant:

static unsigned decode_pred_count(unsigned fullsz, int pattern, int esz)
{
    unsigned elements = fullsz >> esz;
    unsigned bound;

    switch (pattern) {
    case 0x0: /* POW2 */
        return pow2floor(elements);
    case 0x1: /* VL1 */
    case 0x2: /* VL2 */
    case 0x3: /* VL3 */
    case 0x4: /* VL4 */
    case 0x5: /* VL5 */
    case 0x6: /* VL6 */
    case 0x7: /* VL7 */
    case 0x8: /* VL8 */
        bound = pattern;
        break;
    case 0x9: /* VL16 */
    case 0xa: /* VL32 */
    case 0xb: /* VL64 */
    case 0xc: /* VL128 */
    case 0xd: /* VL256 */
        bound = 16 << (pattern - 9);
        break;
    case 0x1d: /* MUL4 */
        return elements - elements % 4;
    case 0x1e: /* MUL3 */
        return elements - elements % 3;
    case 0x1f: /* ALL */
        return elements;
    default:   /* #uimm5 */
        return 0;
    }
    return elements >= bound ? bound : 0;
}